

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O3

bool __thiscall
tinyusdz::ascii::AsciiParser::SepBy1TupleType<double,2ul>
          (AsciiParser *this,char sep,
          vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *result)

{
  pointer *ppaVar1;
  pointer paVar2;
  iterator iVar3;
  bool bVar4;
  StreamReader *pSVar5;
  ulong uVar6;
  char *pcVar7;
  char *pcVar8;
  array<double,_2UL> value;
  array<double,_2UL> value_1;
  array<double,_2UL> local_58;
  string local_48;
  
  paVar2 = (result->
           super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((result->
      super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>).
      _M_impl.super__Vector_impl_data._M_finish != paVar2) {
    (result->super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>)
    ._M_impl.super__Vector_impl_data._M_finish = paVar2;
  }
  bVar4 = SkipWhitespaceAndNewline(this,true);
  if (bVar4) {
    bVar4 = ParseBasicTypeTuple<double,2ul>(this,&local_58);
    if (bVar4) {
      iVar3._M_current =
           (result->
           super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (result->
          super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>::
        _M_realloc_insert<std::array<double,2ul>const&>
                  ((vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>> *)result,
                   iVar3,&local_58);
      }
      else {
        (iVar3._M_current)->_M_elems[0] =
             (double)CONCAT71(local_58._M_elems[0]._1_7_,local_58._M_elems[0]._0_1_);
        (iVar3._M_current)->_M_elems[1] = local_58._M_elems[1];
        ppaVar1 = &(result->
                   super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppaVar1 = *ppaVar1 + 1;
      }
      pSVar5 = this->_sr;
      uVar6 = pSVar5->idx_;
      if (uVar6 < pSVar5->length_) {
        while (pSVar5->binary_[uVar6] != '\0') {
          bVar4 = SkipWhitespaceAndNewline(this,true);
          if (!bVar4) {
            return false;
          }
          bVar4 = Char1(this,(char *)&local_58);
          if (!bVar4) {
            return false;
          }
          if (local_58._M_elems[0]._0_1_ != sep) {
            pSVar5 = this->_sr;
            if ((0 < (long)pSVar5->idx_) && (uVar6 = pSVar5->idx_ - 1, uVar6 <= pSVar5->length_)) {
              pSVar5->idx_ = uVar6;
            }
            break;
          }
          bVar4 = SkipWhitespaceAndNewline(this,true);
          if (!bVar4) {
            return false;
          }
          bVar4 = ParseBasicTypeTuple<double,2ul>(this,(array<double,_2UL> *)&local_48);
          if (!bVar4) break;
          iVar3._M_current =
               (result->
               super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
          if (iVar3._M_current ==
              (result->
              super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
              )._M_impl.super__Vector_impl_data._M_end_of_storage) {
            ::std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>::
            _M_realloc_insert<std::array<double,2ul>const&>
                      ((vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>> *)
                       result,iVar3,(array<double,_2UL> *)&local_48);
          }
          else {
            (iVar3._M_current)->_M_elems[0] = (double)local_48._M_dataplus._M_p;
            (iVar3._M_current)->_M_elems[1] = (double)local_48._M_string_length;
            ppaVar1 = &(result->
                       super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
            *ppaVar1 = *ppaVar1 + 1;
          }
          pSVar5 = this->_sr;
          uVar6 = pSVar5->idx_;
          if (pSVar5->length_ <= uVar6) break;
        }
      }
      if ((result->
          super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>).
          _M_impl.super__Vector_impl_data._M_start !=
          (result->
          super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>).
          _M_impl.super__Vector_impl_data._M_finish) {
        return true;
      }
      pcVar8 = "Empty array.\n";
      pcVar7 = "";
    }
    else {
      pcVar8 = "Not starting with the tuple value of requested type.\n";
      pcVar7 = "";
    }
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,pcVar8,pcVar7);
    PushError(this,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  return false;
}

Assistant:

bool AsciiParser::SepBy1TupleType(const char sep,
                                  std::vector<std::array<T, N>> *result) {
  result->clear();

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  {
    std::array<T, N> value;
    if (!ParseBasicTypeTuple<T, N>(&value)) {
      PushError("Not starting with the tuple value of requested type.\n");
      return false;
    }

    result->push_back(value);
  }

  while (!Eof()) {
    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c != sep) {
      // end
      _sr->seek_from_current(-1);  // unwind single char
      break;
    }

    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    std::array<T, N> value;
    if (!ParseBasicTypeTuple<T, N>(&value)) {
      break;
    }

    result->push_back(value);
  }

  if (result->empty()) {
    PushError("Empty array.\n");
    return false;
  }

  return true;
}